

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O0

QString * __thiscall
QSQLiteDriver::stripDelimiters(QSQLiteDriver *this,QString *identifier,IdentifierType type)

{
  QStringView identifier_00;
  QStringView identifier_01;
  byte bVar1;
  bool bVar2;
  qsizetype qVar3;
  ulong uVar4;
  undefined4 in_ECX;
  QString *in_RDX;
  storage_type *in_RSI;
  QStringView *in_RDI;
  long in_FS_OFFSET;
  QStringBuilder<QStringView_&,_char16_t> QVar5;
  bool rightEscaped;
  bool leftEscaped;
  qsizetype indexOfSeparator;
  QSQLiteDriverPrivate *d;
  QStringView rightName;
  QStringView leftName;
  undefined4 in_stack_fffffffffffffea8;
  CaseSensitivity in_stack_fffffffffffffeac;
  QStringBuilder<QStringView_&,_char16_t> *in_stack_fffffffffffffeb0;
  QStringView *this_00;
  QChar in_stack_fffffffffffffede;
  ushort uVar6;
  QChar local_32;
  QStringView *local_30;
  char16_t local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  d_func((QSQLiteDriver *)0x11979b);
  QChar::QChar<char16_t,_true>(&local_32,L'.');
  qVar3 = QString::indexOf((QString *)in_RDI,in_stack_fffffffffffffede,
                           (qsizetype)in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
  if (-1 < qVar3) {
    QStringView::QStringView<QString,_true>(this_00,(QString *)in_RDI);
    QStringView::first((QStringView *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                       0x11982a);
    QStringView::QStringView<QString,_true>(this_00,(QString *)in_RDI);
    QStringView::sliced(this_00,(qsizetype)in_RDI);
    identifier_00.m_data = in_RSI;
    identifier_00.m_size = (qsizetype)this_00;
    bVar1 = QSQLiteDriverPrivate::isIdentifierEscaped
                      ((QSQLiteDriverPrivate *)
                       CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),identifier_00);
    identifier_01.m_data = in_RSI;
    identifier_01.m_size = (qsizetype)this_00;
    bVar2 = QSQLiteDriverPrivate::isIdentifierEscaped
                      ((QSQLiteDriverPrivate *)
                       CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),identifier_01);
    uVar6 = CONCAT11(bVar1,bVar2);
    if (((bVar1 & 1) != 0) || (bVar2)) {
      if ((bVar1 & 1) != 0) {
        QStringView::sliced(this_00,(qsizetype)in_RDI);
        QStringView::chopped
                  ((QStringView *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                   0x11995d);
      }
      if ((uVar6 & 1) != 0) {
        QStringView::sliced(this_00,(qsizetype)in_RDI);
        QStringView::chopped
                  ((QStringView *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                   0x1199c8);
      }
      QVar5 = ::operator+(in_RDI,(char16_t *)in_stack_fffffffffffffeb0);
      local_30 = QVar5.a;
      local_28 = QVar5.b;
      ::operator+(in_stack_fffffffffffffeb0,
                  (QStringView *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<QStringBuilder<QStringView_&,_char16_t>,_QStringView_&> *)
                 CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      goto LAB_00119ac5;
    }
  }
  uVar4 = (**(code **)(*(long *)in_RSI + 0xf0))(in_RSI,in_RDX,in_ECX);
  if ((uVar4 & 1) == 0) {
    QString::QString((QString *)in_stack_fffffffffffffeb0,
                     (QString *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  }
  else {
    QString::size(in_RDX);
    QString::mid((longlong)in_RDI,(longlong)in_RDX);
  }
LAB_00119ac5:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QString *)this_00;
}

Assistant:

QString QSQLiteDriver::stripDelimiters(const QString &identifier, IdentifierType type) const
{
    Q_D(const QSQLiteDriver);
    const auto indexOfSeparator = identifier.indexOf(u'.');
    if (indexOfSeparator > -1) {
        auto leftName = QStringView{identifier}.first(indexOfSeparator);
        auto rightName = QStringView{identifier}.sliced(indexOfSeparator + 1);
        const auto leftEscaped = d->isIdentifierEscaped(leftName);
        const auto rightEscaped = d->isIdentifierEscaped(rightName);
        if (leftEscaped || rightEscaped) {
            if (leftEscaped)
                leftName = leftName.sliced(1).chopped(1);
            if (rightEscaped)
                rightName = rightName.sliced(1).chopped(1);
            return leftName + u'.' + rightName;
        }
    }

    if (isIdentifierEscaped(identifier, type))
        return identifier.mid(1, identifier.size() - 2);

    return identifier;
}